

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O1

void Ga2_GlaDumpAbsracted(Ga2_Man_t *p,int fVerbose)

{
  Abs_Par_t *pAVar1;
  int *__ptr;
  char *pcVar2;
  Vec_Int_t *pVVar3;
  Gia_Man_t *pGVar4;
  Ga2_Man_t *pGVar5;
  
  pAVar1 = p->pPars;
  if (pAVar1->fDumpMabs != 0) {
    pcVar2 = pAVar1->pFileVabs;
    pGVar5 = p;
    if (pcVar2 == (char *)0x0) {
      pGVar5 = (Ga2_Man_t *)p->pGia->pSpec;
      if (pGVar5 == (Ga2_Man_t *)0x0) {
        pcVar2 = "glabs.aig";
      }
      else {
        pcVar2 = Extra_FileNameGenericAppend((char *)pGVar5,"_gla.aig");
      }
    }
    if (fVerbose != 0) {
      Abc_Print((int)pGVar5,"Dumping miter with abstraction map into file \"%s\"...\n",pcVar2);
    }
    pGVar4 = p->pGia;
    if (pGVar4->vGateClasses != (Vec_Int_t *)0x0) {
      __ptr = pGVar4->vGateClasses->pArray;
      if (__ptr != (int *)0x0) {
        free(__ptr);
        pGVar4->vGateClasses->pArray = (int *)0x0;
      }
      if (pGVar4->vGateClasses != (Vec_Int_t *)0x0) {
        free(pGVar4->vGateClasses);
        pGVar4->vGateClasses = (Vec_Int_t *)0x0;
      }
    }
    pVVar3 = Ga2_ManAbsTranslate(p);
    pGVar4 = p->pGia;
    pGVar4->vGateClasses = pVVar3;
    Gia_AigerWrite(pGVar4,pcVar2,0,0,0);
    return;
  }
  if (pAVar1->fDumpVabs == 0) {
    __assert_fail("p->pPars->fDumpMabs || p->pPars->fDumpVabs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absGla.c"
                  ,0x590,"void Ga2_GlaDumpAbsracted(Ga2_Man_t *, int)");
  }
  if (pAVar1->fDumpVabs == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absGla.c"
                  ,0x5aa,"void Ga2_GlaDumpAbsracted(Ga2_Man_t *, int)");
  }
  pcVar2 = pAVar1->pFileVabs;
  pGVar5 = p;
  if (pcVar2 == (char *)0x0) {
    pGVar5 = (Ga2_Man_t *)p->pGia->pSpec;
    if (pGVar5 == (Ga2_Man_t *)0x0) {
      pcVar2 = "glabs.aig";
    }
    else {
      pcVar2 = Extra_FileNameGenericAppend((char *)pGVar5,"_abs.aig");
    }
  }
  if (fVerbose != 0) {
    Abc_Print((int)pGVar5,"Dumping abstracted model into file \"%s\"...\n",pcVar2);
  }
  pVVar3 = Ga2_ManAbsTranslate(p);
  pGVar4 = Gia_ManDupAbsGates(p->pGia,pVVar3);
  Gia_ManCleanValue(p->pGia);
  Gia_AigerWrite(pGVar4,pcVar2,0,0,0);
  Gia_ManStop(pGVar4);
  if (pVVar3 == (Vec_Int_t *)0x0) {
    return;
  }
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  free(pVVar3);
  return;
}

Assistant:

void Ga2_GlaDumpAbsracted( Ga2_Man_t * p, int fVerbose )
{
    char * pFileName;
    assert( p->pPars->fDumpMabs || p->pPars->fDumpVabs );
    if ( p->pPars->fDumpMabs )
    {
        pFileName = Ga2_GlaGetFileName(p, 0);
        if ( fVerbose )
            Abc_Print( 1, "Dumping miter with abstraction map into file \"%s\"...\n", pFileName );
        // dump abstraction map
        Vec_IntFreeP( &p->pGia->vGateClasses );
        p->pGia->vGateClasses = Ga2_ManAbsTranslate( p );
        Gia_AigerWrite( p->pGia, pFileName, 0, 0, 0 );
    }
    else if ( p->pPars->fDumpVabs )
    {
        Vec_Int_t * vGateClasses;
        Gia_Man_t * pAbs;
        pFileName = Ga2_GlaGetFileName(p, 1);
        if ( fVerbose )
            Abc_Print( 1, "Dumping abstracted model into file \"%s\"...\n", pFileName );
        // dump absracted model
        vGateClasses = Ga2_ManAbsTranslate( p );
        pAbs = Gia_ManDupAbsGates( p->pGia, vGateClasses );
        Gia_ManCleanValue( p->pGia );
        Gia_AigerWrite( pAbs, pFileName, 0, 0, 0 );
        Gia_ManStop( pAbs );
        Vec_IntFreeP( &vGateClasses );
    }
    else assert( 0 );
}